

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::Assembler::_emitFailed
          (Assembler *this,Error err,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,
          Operand_ *o2,Operand_ *o3)

{
  Error EVar1;
  uint in_ECX;
  undefined4 in_EDX;
  CodeEmitter *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  Operand_ opArray [6];
  StringBuilderTmp<256UL> sb;
  undefined4 in_stack_fffffffffffffc4c;
  undefined8 in_stack_fffffffffffffc50;
  Detail *detail;
  undefined4 in_stack_fffffffffffffc58;
  uint32_t in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc68;
  uint32_t in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  uint32_t in_stack_fffffffffffffc74;
  StringBuilder *in_stack_fffffffffffffc78;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  CodeEmitter *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  Detail local_318;
  undefined8 local_308;
  undefined8 local_300;
  undefined1 local_2f8 [264];
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  uint local_1dc;
  undefined4 local_1d8;
  undefined8 *local_1c8;
  CodeEmitter **local_1c0;
  undefined1 **local_1b8;
  Detail *local_1b0;
  undefined8 local_1a0;
  char *local_198;
  undefined1 **local_190;
  undefined8 local_188;
  char *local_180;
  undefined1 **local_178;
  uint32_t *local_170;
  undefined8 *local_168;
  CodeEmitter **local_160;
  CodeEmitter **local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  RegOnly *local_108;
  uint local_100;
  undefined4 local_fc;
  undefined1 *local_f8;
  undefined4 local_e0;
  undefined4 local_dc;
  CodeEmitter **local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined8 *local_c8;
  undefined4 local_c0;
  undefined4 local_bc;
  CodeEmitter **local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 *local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined8 *local_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  CodeEmitter **local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  CodeInfo *local_38;
  CodeInfo *local_30;
  RegOnly *local_28;
  undefined4 local_20;
  undefined4 local_1c;
  RegOnly *local_18;
  undefined1 *local_10;
  undefined1 **local_8;
  
  local_1b8 = (undefined1 **)&local_318;
  local_10 = &NoInit;
  local_318._0_8_ = local_2f8;
  local_2f8[0] = 0;
  local_318.extraReg._signature = 0;
  local_318.extraReg._id = 0;
  local_308 = 0x100;
  local_300 = 0;
  local_1f0 = in_R9;
  local_1e8 = in_R8;
  local_1dc = in_ECX;
  local_1d8 = in_EDX;
  local_8 = local_1b8;
  local_180 = DebugUtils::errorAsString((Error)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  local_178 = (undefined1 **)&local_318;
  local_188 = 0xffffffffffffffff;
  StringBuilder::_opString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),(size_t)in_RDI);
  local_190 = (undefined1 **)&local_318;
  local_198 = ": ";
  local_1a0 = 0xffffffffffffffff;
  StringBuilder::_opString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),(size_t)in_RDI);
  local_118 = &local_378;
  local_120 = local_1e8;
  local_378 = *local_1e8;
  local_370 = local_1e8[1];
  local_128 = &local_368;
  local_130 = local_1f0;
  local_368 = *local_1f0;
  local_360 = local_1f0[1];
  local_138 = &local_358;
  local_358 = *in_stack_00000008;
  local_350 = in_stack_00000008[1];
  local_148 = &local_348;
  local_150 = in_stack_00000010;
  local_348 = *in_stack_00000010;
  local_340 = in_stack_00000010[1];
  if ((local_1dc & 8) == 0) {
    local_1c0 = &local_338;
    local_dc = 0;
    local_e0 = 0;
    local_6c = 0;
    local_70 = 0;
    local_5c = 0;
    local_60 = 0;
    local_338 = (CodeEmitter *)0x0;
    local_bc = 0;
    local_c0 = 0;
    local_88 = &local_330;
    local_8c = 0;
    local_90 = 0;
    local_4c = 0;
    local_50 = 0;
    local_330 = 0;
    local_1c8 = &local_328;
    local_cc = 0;
    local_d0 = 0;
    local_7c = 0;
    local_80 = 0;
    local_54 = 0;
    local_58 = 0;
    local_328 = 0;
    local_ac = 0;
    local_b0 = 0;
    local_98 = &local_320;
    local_9c = 0;
    local_a0 = 0;
    local_44 = 0;
    local_48 = 0;
    local_320 = 0;
    local_d8 = local_1c0;
    local_c8 = local_1c8;
    local_b8 = local_1c0;
    local_a8 = local_1c8;
    local_78 = local_1c8;
    local_68 = local_1c0;
  }
  else {
    local_158 = &local_338;
    local_160 = &in_RDI[1]._nextEmitter;
    local_338 = *local_160;
    local_330._0_1_ = in_RDI[1]._type;
    local_330._1_1_ = in_RDI[1]._destroyed;
    local_330._2_1_ = in_RDI[1]._finalized;
    local_330._3_1_ = in_RDI[1]._reserved;
    local_330._4_4_ = in_RDI[1]._lastError;
    local_168 = &local_328;
    local_170 = &in_RDI[1]._privateData;
    local_328._0_4_ = in_RDI[1]._privateData;
    local_328._4_4_ = in_RDI[1]._globalHints;
    local_320._0_4_ = in_RDI[1]._globalOptions;
    local_320._4_4_ = in_RDI[1]._options;
  }
  local_38 = &in_RDI->_codeInfo;
  local_108 = &in_RDI->_extraReg;
  local_f8 = &stack0xfffffffffffffc78;
  local_fc = local_1d8;
  local_100 = local_1dc;
  detail = &local_318;
  local_30 = local_38;
  Logging::formatInstruction
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc6c,in_RDI,in_stack_fffffffffffffc5c,detail,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc4c,6),(*local_108)._signature);
  in_RDI->_options = 0;
  local_28 = &in_RDI->_extraReg;
  local_1c = 0;
  local_20 = 0;
  local_28->_signature = 0;
  (in_RDI->_extraReg)._id = 0;
  in_RDI->_inlineComment = (char *)0x0;
  local_1b0 = detail;
  local_18 = local_28;
  EVar1 = CodeEmitter::setLastError
                    ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                     (Error)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x1eb4a4);
  return EVar1;
}

Assistant:

Error Assembler::_emitFailed(
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {

  StringBuilderTmp<256> sb;
  sb.appendString(DebugUtils::errorAsString(err));
  sb.appendString(": ");

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, 0,
    this, getArchType(),
    Inst::Detail(instId, options, _extraReg), opArray, 6);

  resetOptions();
  resetExtraReg();
  resetInlineComment();
  return setLastError(err, sb.getData());
}